

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzdohrsubstruct.cpp
# Opt level: O2

void __thiscall
TPZDohrSubstruct<std::complex<double>_>::PrepareSystems
          (TPZDohrSubstruct<std::complex<double>_> *this)

{
  TPZFMatrix<std::complex<double>_> *this_00;
  list<long,_std::allocator<long>_> *plVar1;
  size_t newRows;
  undefined1 auVar2 [16];
  complex<double> beta;
  complex<double> *pcVar3;
  TPZFMatrix<std::complex<double>_> *pTVar4;
  long lVar5;
  long newRows_00;
  ulong in_R9;
  long lVar6;
  int64_t iVar7;
  _List_node_base *p_Var8;
  TPZStepSolver<std::complex<double>_> *this_01;
  TPZAutoPointer<TPZBaseMatrix> in_stack_fffffffffffffd78;
  TPZStepSolver<std::complex<double>_> *in_stack_fffffffffffffd80;
  int opt;
  TPZFMatrix<std::complex<double>_> *pTVar9;
  TPZFMatrix<std::complex<double>_> I_star;
  TPZFMatrix<std::complex<double>_> C_star_trans;
  TPZFMatrix<std::complex<double>_> KeC;
  TPZFMatrix<std::complex<double>_> C_transposed;
  
  iVar7 = (this->fCoarseIndex).fNElements;
  pTVar9 = &this->fC;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (&C_transposed,
             (this->fC).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol,
             (this->fC).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow);
  TPZFMatrix<std::complex<double>_>::Transpose
            (pTVar9,&C_transposed.super_TPZMatrix<std::complex<double>_>);
  lVar6 = (long)(int)iVar7;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&KeC,(long)this->fNEquations,lVar6);
  this_01 = &this->fInvertedStiffness;
  TPZStepSolver<std::complex<double>_>::Solve
            (this_01,&C_transposed,&KeC,(TPZFMatrix<std::complex<double>_> *)0x0);
  newRows = (this->fInvertedStiffness).fSingular.super__List_base<long,_std::allocator<long>_>.
            _M_impl._M_node._M_size;
  I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable =
       (_func_int **)
       (this->fInvertedStiffness).super_TPZMatrixSolver<std::complex<double>_>.fContainer.fRef;
  LOCK();
  (((TPZReference *)
   I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
   _vptr_TPZSavable)->fCounter).super___atomic_base<int>._M_i =
       (((TPZReference *)
        I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable)->fCounter).super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pTVar4 = &this->fNullPivots;
  TPZFMatrix<std::complex<double>_>::Resize
            (pTVar4,newRows,
             (((TPZReference *)
              I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable)->fPointer->super_TPZBaseMatrix).fCol);
  TPZAutoPointer<TPZMatrix<std::complex<double>_>_>::~TPZAutoPointer
            ((TPZAutoPointer<TPZMatrix<std::complex<double>_>_> *)&I_star);
  iVar7 = 0;
  memset((this->fNullPivots).fElem,0,
         (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10)
  ;
  (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  if ((this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow != 0) {
    plVar1 = &(this->fInvertedStiffness).fSingular;
    lVar5 = 0;
    p_Var8 = (_List_node_base *)plVar1;
    while (p_Var8 = (((_List_base<long,_std::allocator<long>_> *)&p_Var8->_M_next)->_M_impl)._M_node
                    .super__List_node_base._M_next, p_Var8 != (_List_node_base *)plVar1) {
      pcVar3 = TPZFMatrix<std::complex<double>_>::operator()
                         (pTVar4,lVar5,(int64_t)p_Var8[1]._M_next);
      *(undefined8 *)pcVar3->_M_value = 0x3ff0000000000000;
      *(undefined8 *)(pcVar3->_M_value + 8) = 0;
      lVar5 = lVar5 + 1;
    }
    iVar7 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
    in_stack_fffffffffffffd80 = this_01;
  }
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&I_star,iVar7 + lVar6,iVar7 + lVar6);
  memset(I_star.fElem,0,
         I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow *
         I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol * 0x10);
  I_star.super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fDecomposed = '\0';
  for (lVar5 = lVar6;
      newRows_00 = (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                   fRow + lVar6, lVar5 < newRows_00; lVar5 = lVar5 + 1) {
    pcVar3 = TPZFMatrix<std::complex<double>_>::operator()(&I_star,lVar5,lVar5);
    *(undefined8 *)pcVar3->_M_value = 0x3ff0000000000000;
    *(undefined8 *)(pcVar3->_M_value + 8) = 0;
  }
  this_00 = &this->fC_star;
  TPZFMatrix<std::complex<double>_>::Resize(this_00,newRows_00,(long)this->fNEquations);
  TPZMatrix<std::complex<double>_>::PutSub
            (&this_00->super_TPZMatrix<std::complex<double>_>,0,0,pTVar9);
  opt = (int)pTVar9;
  TPZMatrix<std::complex<double>_>::PutSub
            (&this_00->super_TPZMatrix<std::complex<double>_>,lVar6,0,pTVar4);
  pTVar9 = &this->fKeC_star;
  TPZFMatrix<std::complex<double>_>::Resize
            (pTVar9,(long)this->fNEquations,
             (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
             lVar6);
  TPZFMatrix<std::complex<double>_>::TPZFMatrix
            (&C_star_trans,(long)this->fNEquations,
             (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow +
             lVar6);
  TPZFMatrix<std::complex<double>_>::Transpose
            (this_00,&C_star_trans.super_TPZMatrix<std::complex<double>_>);
  TPZStepSolver<std::complex<double>_>::Solve
            (this_01,&C_star_trans,pTVar9,(TPZFMatrix<std::complex<double>_> *)0x0);
  pTVar4 = (TPZFMatrix<std::complex<double>_> *)operator_new(0x90);
  lVar6 = lVar6 + (this->fNullPivots).super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.
                  fRow;
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(pTVar4,lVar6,lVar6);
  beta._M_value._8_8_ = in_stack_fffffffffffffd80;
  beta._M_value._0_8_ = in_stack_fffffffffffffd78.fRef;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = in_R9;
  TPZFMatrix<std::complex<double>_>::MultAdd
            (this_00,pTVar9,&I_star,pTVar4,(complex<double>)(auVar2 << 0x40),beta,opt);
  TPZAutoPointer<TPZBaseMatrix>::TPZAutoPointer<TPZFMatrix<std::complex<double>>>
            ((TPZAutoPointer<TPZBaseMatrix> *)&stack0xfffffffffffffd78,pTVar4);
  TPZMatrixSolver<std::complex<double>_>::SetMatrix
            (&(this->finv).super_TPZMatrixSolver<std::complex<double>_>,
             (TPZAutoPointer<TPZBaseMatrix> *)&stack0xfffffffffffffd78);
  TPZAutoPointer<TPZBaseMatrix>::~TPZAutoPointer
            ((TPZAutoPointer<TPZBaseMatrix> *)&stack0xfffffffffffffd78);
  TPZStepSolver<std::complex<double>_>::SetDirect(&this->finv,ELU);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&C_star_trans);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&I_star);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&KeC);
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&C_transposed);
  return;
}

Assistant:

void TPZDohrSubstruct<TVar>::PrepareSystems() {
	int ncoarse = fCoarseIndex.NElements();
	//TPZFMatrix<TVar> C_transposed;
	/****************************************
	 * TEMPORARIO!!!!!!!!!!!!!!
	 */
	//  int nc = fC.Cols();
	//  fC.Redim(1,nc);
	//  fC(0,nc-1) = 1.;
	
	/*
	 *******************************************/
	/** Tou mantendo isso abaixo só pra fatoracao de K ser TVarizada e se obter os pivos nulos (caso haja) */
	
	//  ofstream out("saida.nb");
	//  this->fStiffness->Print("fK = ",out,EMathematicaInput);
	//  fC.Print("fCi = ",out,EMathematicaInput);
	TPZFMatrix<TVar> C_transposed(fC.Cols(),fC.Rows());
	fC.Transpose(&C_transposed);
	//Ke_inv*C(i)_trans
	TPZFMatrix<TVar> KeC(fNEquations,ncoarse);
	fInvertedStiffness.Solve(C_transposed,KeC);
	/** */
#ifdef PZ_LOG
	{
		std::stringstream sout;
		sout << "Number of zero pivots of the substructure : " << fInvertedStiffness.Singular().size();
		LOGPZ_DEBUG(logger,sout.str());
	}
#endif
	//  std::cout << KeC;
	//  int neq = fInvertedStiffness.Matrix()->Rows();
	//Constructing C barra = NullPivots
	fNullPivots.Resize(fInvertedStiffness.Singular().size(),fInvertedStiffness.Matrix()->Cols());
	fNullPivots.Zero();
	//  fEigenVectors.Redim(fInvertedStiffness.Matrix()->Rows(),fInvertedStiffness.Singular().size());
	if(fNullPivots.Rows())
	{
		//    out << "NullPivots = {";
		int count = 0;
		std::list<int64_t>::iterator it = fInvertedStiffness.Singular().begin();
		for(;it != fInvertedStiffness.Singular().end(); it++,count++)
		{
			//      out << *it;
			//      if(count < fInvertedStiffness.Singular().size()-1) out << ",";
			fNullPivots(count,*it) = 1.;
		}
		//    out << "};\n";
		//    fInvertedStiffness.Solve(fEigenVectors,fEigenVectors);
	}
	//  NullPivots.Print("fNullPivots = ",out,EMathematicaInput);
	
	//Constructing I star
	TPZFMatrix<TVar> I_star(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	I_star.Zero();
	int i;
	for (i=ncoarse;i<ncoarse+fNullPivots.Rows();i++) {
		I_star(i,i)=1;
	}
	//Constructing C_star and storing in fC_star
	fC_star.Resize(ncoarse+fNullPivots.Rows(),fNEquations);
	fC_star.PutSub(0,0,fC);
	fC_star.PutSub(ncoarse,0,fNullPivots);
	//  C_star.Print("CStar = ",out,EMathematicaInput);
	//constructing K_star_inv*C_star_trans and storing it in fKeC_star
	fKeC_star.Resize(fNEquations,ncoarse+fNullPivots.Rows());
	TPZFMatrix<TVar> C_star_trans(fNEquations,ncoarse+fNullPivots.Rows());
	fC_star.Transpose(&C_star_trans);
	fInvertedStiffness.Solve(C_star_trans,fKeC_star);
	//Constructing StepSolver finv
	TPZFMatrix<TVar> *temp1 = new TPZFMatrix<TVar>(ncoarse+fNullPivots.Rows(),ncoarse+fNullPivots.Rows());
	fC_star.MultAdd(fKeC_star,I_star,*temp1,-1,1,0);
	finv.SetMatrix(temp1);
	finv.SetDirect(ELU);
}